

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O2

int main(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  GLFWwindow *handle;
  uchar *puVar5;
  int joy;
  int iVar6;
  int iVar7;
  long lVar8;
  GLint GVar9;
  int iVar10;
  GLfloat GVar11;
  int local_78;
  int width;
  int local_70;
  int axis_count;
  int local_68;
  float local_64;
  int local_60;
  float local_5c;
  ulong local_58;
  long local_50;
  GLFWwindow *local_48;
  ulong local_40;
  float *local_38;
  
  joysticks[0xc] = 0;
  joysticks[0xd] = 0;
  joysticks[0xe] = 0;
  joysticks[0xf] = 0;
  joysticks[8] = 0;
  joysticks[9] = 0;
  joysticks[10] = 0;
  joysticks[0xb] = 0;
  joysticks[4] = 0;
  joysticks[5] = 0;
  joysticks[6] = 0;
  joysticks[7] = 0;
  joysticks[0] = 0;
  joysticks[1] = 0;
  joysticks[2] = 0;
  joysticks[3] = 0;
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    for (iVar3 = 0; iVar3 != 0x10; iVar3 = iVar3 + 1) {
      iVar4 = glfwJoystickPresent(iVar3);
      if (iVar4 != 0) {
        joystick_callback(iVar3,0x40001);
      }
    }
    glfwSetJoystickCallback(joystick_callback);
    handle = glfwCreateWindow(0x280,0x1e0,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      local_48 = handle;
      while( true ) {
        iVar3 = glfwWindowShouldClose(handle);
        if (iVar3 != 0) break;
        (*glad_glClear)(0x4000);
        glfwGetFramebufferSize(handle,&width,&local_78);
        (*glad_glMatrixMode)(0x1701);
        (*glad_glLoadIdentity)();
        (*glad_glOrtho)(0.0,(double)width,(double)local_78,0.0,1.0,-1.0);
        (*glad_glMatrixMode)(0x1700);
        lVar8 = 0;
        while (handle = local_48, iVar3 = width, lVar8 < joystick_count) {
          iVar10 = (local_78 * (int)lVar8) / joystick_count;
          lVar1 = (long)joystick_count;
          lVar2 = (long)local_78;
          iVar4 = (int)(lVar2 / lVar1);
          local_58 = (long)(iVar4 * 3) / 4 & 0xffffffff;
          local_50 = lVar8;
          local_38 = glfwGetJoystickAxes(joysticks[lVar8],&axis_count);
          if (axis_count != 0) {
            local_40 = (long)iVar3 / (long)axis_count & 0xffffffff;
            local_60 = (int)local_58 + iVar10;
            local_64 = (float)((int)local_58 + -5);
            local_68 = iVar10 + 5;
            GVar9 = 0;
            for (lVar8 = 0; lVar8 < axis_count; lVar8 = lVar8 + 1) {
              local_5c = (local_38[lVar8] * 0.5 + 0.5) * local_64;
              (*glad_glColor3f)(0.3,0.3,0.3);
              iVar6 = (int)local_40 + GVar9;
              (*glad_glRecti)(GVar9,iVar10,iVar6,local_60);
              (*glad_glColor3f)(1.0,1.0,1.0);
              (*glad_glRecti)(GVar9,iVar10 + (int)local_5c,iVar6,(int)local_5c + local_68);
              GVar9 = iVar6;
            }
          }
          puVar5 = glfwGetJoystickButtons(joysticks[local_50],&local_70);
          if (local_70 != 0) {
            iVar3 = iVar3 / local_70;
            iVar10 = (int)local_58 + iVar10;
            iVar6 = 0;
            for (lVar8 = 0; lVar8 < local_70; lVar8 = lVar8 + 1) {
              if (puVar5[lVar8] == '\0') {
                GVar11 = 0.3;
              }
              else {
                GVar11 = 1.0;
              }
              (*glad_glColor3f)(GVar11,GVar11,GVar11);
              iVar7 = iVar3 + iVar6;
              (*glad_glRecti)(iVar6,iVar10,iVar7,
                              (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 |
                                          lVar2 / lVar1 & 0xffffffffU) / 4) + iVar10);
              iVar6 = iVar7;
            }
          }
          lVar8 = local_50 + 1;
        }
        glfwSwapBuffers(local_48);
        glfwPollEvents();
        fflush(_stdout);
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    find_joysticks();
    glfwSetJoystickCallback(joystick_callback);

    window = glfwCreateWindow(640, 480, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        draw_joysticks(window);

        glfwSwapBuffers(window);
        glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}